

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O0

void GEN(AES_KEY *key,int alpha,int n,uchar **k0,uchar **k1)

{
  uint *puVar1;
  uint **ppuVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  undefined4 in_register_00000034;
  long lVar6;
  long lVar7;
  uchar *__src;
  long lVar8;
  AES_KEY *pAVar9;
  uchar *__dest;
  int *in_R9;
  uint *extraout_XMM0_Qa;
  uint *extraout_XMM0_Qa_00;
  uint *extraout_XMM0_Qa_01;
  uint *extraout_XMM0_Qa_02;
  ulong extraout_XMM0_Qa_03;
  ulong extraout_XMM0_Qa_04;
  ulong uVar10;
  uint *extraout_XMM0_Qb;
  uint *extraout_XMM0_Qb_00;
  uint *extraout_XMM0_Qb_01;
  uint *extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  ulong extraout_XMM0_Qb_04;
  ulong uVar11;
  block input;
  block input_00;
  block input_01;
  block input_02;
  block input_03;
  block input_04;
  block input_05;
  undefined8 uStack_580;
  uint *local_578 [3];
  uint **local_560;
  uchar *local_558;
  uchar *buff1;
  uchar *buff0;
  ulong uStack_540;
  undefined8 uStack_538;
  __m128i v2_6;
  __m128i v1_6;
  __m128i v2_5;
  __m128i v1_5;
  __m128i v2_4;
  __m128i v1_4;
  __m128i v2_3;
  __m128i v1_3;
  __m128i v2_2;
  __m128i v1_2;
  __m128i v2_1;
  __m128i v1_1;
  __m128i v2;
  __m128i v1;
  ulong uStack_3e8;
  char shift;
  block finalblock;
  uint local_3d0;
  int alphabit;
  int lose;
  int keep;
  int t1 [2];
  int t0 [2];
  block s1 [2];
  block s0 [2];
  int local_36c;
  int i;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int maxlayer;
  uchar **k1_local;
  uchar **k0_local;
  int n_local;
  int alpha_local;
  AES_KEY *key_local;
  
  lVar6 = CONCAT44(in_register_00000034,alpha);
  uVar3 = n - 7;
  local_560 = local_578 + (ulong)(n - 6) * -4;
  local_578[2] = (uint *)((long)local_560 - ((ulong)(n - 6) * 8 + 0xf & 0xfffffffffffffff0));
  local_578[0] = local_578[2] + (ulong)uVar3 * -4;
  puVar5 = (undefined8 *)((long)local_578[0] - ((ulong)uVar3 * 8 + 0xf & 0xfffffffffffffff0));
  local_578[1] = (uint *)puVar5;
  puVar5[-1] = 0x1016a8;
  pAVar9 = key;
  dpf_random_block();
  ppuVar2 = local_560;
  *local_560 = extraout_XMM0_Qa;
  ppuVar2[1] = extraout_XMM0_Qb;
  puVar5[-1] = 0x1016b8;
  dpf_random_block();
  ppuVar2 = local_560;
  puVar1 = local_578[2];
  local_560[2] = extraout_XMM0_Qa_00;
  ppuVar2[3] = extraout_XMM0_Qb_00;
  *puVar1 = (int)*(char *)ppuVar2 & 1;
  puVar1[1] = *puVar1 ^ 1;
  puVar5[-1] = 0x1016e4;
  input[1] = lVar6;
  input[0] = (longlong)pAVar9;
  dpf_set_lsb_zero(input);
  ppuVar2 = local_560;
  *local_560 = extraout_XMM0_Qa_01;
  ppuVar2[1] = extraout_XMM0_Qb_01;
  puVar5[-1] = 0x1016f9;
  input_00[1] = lVar6;
  input_00[0] = (longlong)pAVar9;
  dpf_set_lsb_zero(input_00);
  ppuVar2 = local_560;
  local_560[2] = extraout_XMM0_Qa_02;
  ppuVar2[3] = extraout_XMM0_Qb_02;
  for (local_36c = 1; local_36c <= (int)uVar3; local_36c = local_36c + 1) {
    input_04[1] = s0[0] + 1;
    puVar5[-1] = 0x10176f;
    input_04[0] = (longlong)(s1[1] + 1);
    PRG(key,input_04,(block *)t1,(block *)(t1 + 1),in_R9,(int *)*puVar5);
    input_05[1] = s1[0] + 1;
    puVar5[-1] = 0x1017be;
    input_05[0] = (longlong)t0;
    PRG(key,input_05,(block *)&lose,(block *)&keep,in_R9,(int *)*puVar5);
    puVar5[-1] = 0x1017d5;
    uVar4 = getbit(alpha,n,local_36c);
    alphabit = (int)(uVar4 != 0);
    local_3d0 = (uint)(uVar4 == 0);
    uVar10 = s0[(int)local_3d0][0];
    lVar8 = (long)(int)local_3d0;
    uVar11 = s1[lVar8][0];
    *(ulong *)(local_578[0] + (long)(local_36c + -1) * 4) =
         s1[(long)(int)local_3d0 + 1][1] ^ *(ulong *)(t0 + lVar8 * 4);
    *(ulong *)((long)(local_578[0] + (long)(local_36c + -1) * 4) + 8) = uVar10 ^ uVar11;
    *(uint *)((long)local_578[1] + (long)(local_36c + -1) * 8) = t1[0] ^ lose ^ uVar4 ^ 1;
    *(uint *)((long)local_578[1] + (long)(local_36c + -1) * 8 + 4) = t1[1] ^ keep ^ uVar4;
    if (local_578[2][(long)(local_36c + -1) * 2] == 1) {
      uVar10 = s0[alphabit][0];
      lVar8 = (long)(local_36c + -1);
      uVar11 = *(ulong *)((long)(local_578[0] + lVar8 * 4) + 8);
      local_560[(long)local_36c * 4] =
           (uint *)(s1[(long)alphabit + 1][1] ^ *(ulong *)(local_578[0] + lVar8 * 4));
      (local_560 + (long)local_36c * 4)[1] = (uint *)(uVar10 ^ uVar11);
      local_578[2][(long)local_36c * 2] =
           t1[alphabit] ^
           *(uint *)((long)local_578[1] + (long)alphabit * 4 + (long)(local_36c + -1) * 8);
    }
    else {
      puVar1 = (uint *)s0[alphabit][0];
      local_560[(long)local_36c * 4] = (uint *)s1[(long)alphabit + 1][1];
      (local_560 + (long)local_36c * 4)[1] = puVar1;
      local_578[2][(long)local_36c * 2] = t1[alphabit];
    }
    if (local_578[2][(long)(local_36c + -1) * 2 + 1] == 1) {
      uVar10 = s1[alphabit][0];
      lVar8 = (long)(local_36c + -1);
      uVar11 = *(ulong *)((long)(local_578[0] + lVar8 * 4) + 8);
      local_560[(long)local_36c * 4 + 2] =
           (uint *)(s1[(long)alphabit + -1][1] ^ *(ulong *)(local_578[0] + lVar8 * 4));
      local_560[(long)local_36c * 4 + 3] = (uint *)(uVar10 ^ uVar11);
      lVar6 = (long)alphabit;
      local_578[2][(long)local_36c * 2 + 1] =
           (&lose)[alphabit] ^
           *(uint *)((long)local_578[1] + lVar6 * 4 + (long)(local_36c + -1) * 8);
    }
    else {
      lVar7 = (long)alphabit;
      lVar6 = lVar7 * 0x10;
      puVar1 = (uint *)s1[lVar7][0];
      local_560[(long)local_36c * 4 + 2] = (uint *)s1[lVar7 + -1][1];
      local_560[(long)local_36c * 4 + 3] = puVar1;
      local_578[2][(long)local_36c * 2 + 1] = (&lose)[alphabit];
    }
    pAVar9 = (AES_KEY *)(lVar8 * 0x10);
  }
  puVar5[-1] = 0x101b53;
  input_01[1] = lVar6;
  input_01[0] = (longlong)pAVar9;
  dpf_reverse_lsb(input_01);
  uStack_3e8 = extraout_XMM0_Qa_03;
  finalblock[0] = extraout_XMM0_Qb_03;
  if ((alpha & 0x40U) != 0) {
    uStack_3e8 = 0;
    finalblock[0] = extraout_XMM0_Qa_03;
  }
  if ((alpha & 0x20U) != 0) {
    finalblock[0] = finalblock[0] | uStack_3e8 >> 0x20;
    uStack_3e8 = uStack_3e8 << 0x20;
  }
  if ((alpha & 0x10U) != 0) {
    finalblock[0] = finalblock[0] | uStack_3e8 >> 0x30;
    uStack_3e8 = uStack_3e8 << 0x10;
  }
  if ((alpha & 8U) != 0) {
    finalblock[0] = finalblock[0] | uStack_3e8 >> 0x38;
    uStack_3e8 = uStack_3e8 << 8;
  }
  if ((alpha & 4U) != 0) {
    finalblock[0] = finalblock[0] | uStack_3e8 >> 0x3c;
    uStack_3e8 = uStack_3e8 << 4;
  }
  if ((alpha & 2U) != 0) {
    finalblock[0] = finalblock[0] | uStack_3e8 >> 0x3e;
    uStack_3e8 = uStack_3e8 << 2;
  }
  if ((alpha & 1U) != 0) {
    buff0 = (uchar *)(uStack_3e8 << 1);
    uStack_538 = 0;
    v2_6[0] = uStack_3e8 >> 0x3f;
    uStack_540 = finalblock[0] | v2_6[0];
    v2_6[1] = (longlong)buff0;
  }
  puVar5[-1] = 0x102138;
  input_02[1] = lVar6;
  input_02[0] = (longlong)pAVar9;
  dpf_cb(input_02);
  puVar5[-1] = 0x102145;
  input_03[1] = lVar6;
  input_03[0] = (longlong)pAVar9;
  dpf_reverse_lsb(input_03);
  uVar10 = extraout_XMM0_Qa_04 ^ (ulong)local_560[(long)(int)uVar3 * 4] ^
           (ulong)local_560[(long)(int)uVar3 * 4 + 2];
  uVar11 = extraout_XMM0_Qb_04 ^ (ulong)(local_560 + (long)(int)uVar3 * 4)[1] ^
           (ulong)local_560[(long)(int)uVar3 * 4 + 3];
  puVar5[-1] = 0x1021f1;
  buff1 = (uchar *)malloc((long)(int)(uVar3 * 0x12 + 0x22));
  puVar5[-1] = 0x10220d;
  local_558 = (uchar *)malloc((long)(int)(uVar3 * 0x12 + 0x22));
  if ((buff1 != (uchar *)0x0) && (local_558 != (uchar *)0x0)) {
    *buff1 = (uchar)n;
    *(uint **)(buff1 + 1) = *local_560;
    *(uint **)(buff1 + 9) = local_560[1];
    buff1[0x11] = (uchar)*local_578[2];
    for (local_36c = 1; local_36c <= (int)uVar3; local_36c = local_36c + 1) {
      *(undefined8 *)(buff1 + local_36c * 0x12) =
           *(undefined8 *)(local_578[0] + (long)(local_36c + -1) * 4);
      *(undefined8 *)(buff1 + (long)(local_36c * 0x12) + 8) =
           *(undefined8 *)(local_578[0] + (long)(local_36c + -1) * 4 + 2);
      buff1[local_36c * 0x12 + 0x10] =
           (uchar)*(undefined4 *)((long)local_578[1] + (long)(local_36c + -1) * 8);
      buff1[local_36c * 0x12 + 0x11] =
           (uchar)*(undefined4 *)((long)local_578[1] + (long)(local_36c + -1) * 8 + 4);
    }
    lVar6 = (long)(int)(uVar3 * 0x12 + 0x12);
    *(ulong *)(buff1 + lVar6) = uVar10;
    *(ulong *)(buff1 + lVar6 + 8) = uVar11;
    *local_558 = (uchar)n;
    __dest = local_558 + 0x12;
    __src = buff1 + 0x12;
    puVar5[-1] = 0x1023ab;
    memcpy(__dest,__src,(long)(int)(uVar3 * 0x12));
    *(uint **)(local_558 + 1) = local_560[2];
    *(uint **)(local_558 + 9) = local_560[3];
    local_558[0x11] = (uchar)local_578[2][1];
    lVar6 = (long)(int)(uVar3 * 0x12 + 0x12);
    *(ulong *)(local_558 + lVar6) = uVar10;
    *(ulong *)(local_558 + lVar6 + 8) = uVar11;
    *k0 = buff1;
    *k1 = local_558;
    return;
  }
  puVar5[-1] = 0x102236;
  printf("Memory allocation failed\n");
  puVar5[-1] = 0x102240;
  exit(1);
}

Assistant:

void GEN(AES_KEY *key, int alpha, int n, unsigned char** k0, unsigned char **k1){
	int maxlayer = n - 7;
	//int maxlayer = n;

	block s[maxlayer + 1][2];
	int t[maxlayer + 1 ][2];
	block sCW[maxlayer];
	int tCW[maxlayer][2];

	s[0][0] = dpf_random_block();
	s[0][1] = dpf_random_block();
	t[0][0] = dpf_lsb(s[0][0]);
	t[0][1] = t[0][0] ^ 1;
	s[0][0] = dpf_set_lsb_zero(s[0][0]);
	s[0][1] = dpf_set_lsb_zero(s[0][1]);

	int i;
	block s0[2], s1[2]; // 0=L,1=R
	#define LEFT 0
	#define RIGHT 1
	int t0[2], t1[2];
	for(i = 1; i<= maxlayer; i++){
		PRG(key, s[i-1][0], &s0[LEFT], &s0[RIGHT], &t0[LEFT], &t0[RIGHT]);
		PRG(key, s[i-1][1], &s1[LEFT], &s1[RIGHT], &t1[LEFT], &t1[RIGHT]);

		int keep, lose;
		int alphabit = getbit(alpha, n, i);
		if(alphabit == 0){
			keep = LEFT;
			lose = RIGHT;
		}else{
			keep = RIGHT;
			lose = LEFT;
		}

		sCW[i-1] = dpf_xor(s0[lose], s1[lose]);

		tCW[i-1][LEFT] = t0[LEFT] ^ t1[LEFT] ^ alphabit ^ 1;
		tCW[i-1][RIGHT] = t0[RIGHT] ^ t1[RIGHT] ^ alphabit;

		if(t[i-1][0] == 1){
			s[i][0] = dpf_xor(s0[keep], sCW[i-1]);
			t[i][0] = t0[keep] ^ tCW[i-1][keep];
		}else{
			s[i][0] = s0[keep];
			t[i][0] = t0[keep];
		}

		if(t[i-1][1] == 1){
			s[i][1] = dpf_xor(s1[keep], sCW[i-1]);
			t[i][1] = t1[keep] ^ tCW[i-1][keep];
		}else{
			s[i][1] = s1[keep];
			t[i][1] = t1[keep];
		}
	}

	block finalblock;
	finalblock = dpf_zero_block();
	finalblock = dpf_reverse_lsb(finalblock);

	char shift = (alpha) & 127;
	if(shift & 64){
		finalblock = dpf_left_shirt(finalblock, 64);
	}
	if(shift & 32){
		finalblock = dpf_left_shirt(finalblock, 32);
	}
	if(shift & 16){
		finalblock = dpf_left_shirt(finalblock, 16);
	}
	if(shift & 8){
		finalblock = dpf_left_shirt(finalblock, 8);
	}
	if(shift & 4){
		finalblock = dpf_left_shirt(finalblock, 4);
	}
	if(shift & 2){
		finalblock = dpf_left_shirt(finalblock, 2);
	}
	if(shift & 1){
		finalblock = dpf_left_shirt(finalblock, 1);
	}
	dpf_cb(finalblock);
	finalblock = dpf_reverse_lsb(finalblock);

	finalblock = dpf_xor(finalblock, s[maxlayer][0]);
	finalblock = dpf_xor(finalblock, s[maxlayer][1]);

	unsigned char *buff0;
	unsigned char *buff1;
	buff0 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);
	buff1 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);

	if(buff0 == NULL || buff1 == NULL){
		printf("Memory allocation failed\n");
		exit(1);
	}

	buff0[0] = n;
	memcpy(&buff0[1], &s[0][0], 16);
	buff0[17] = t[0][0];
	for(i = 1; i <= maxlayer; i++){
		memcpy(&buff0[18 * i], &sCW[i-1], 16);
		buff0[18 * i + 16] = tCW[i-1][0];
		buff0[18 * i + 17] = tCW[i-1][1]; 
	}
	memcpy(&buff0[18 * maxlayer + 18], &finalblock, 16); 

	buff1[0] = n;
	memcpy(&buff1[18], &buff0[18], 18 * (maxlayer));
	memcpy(&buff1[1], &s[0][1], 16);
	buff1[17] = t[0][1];
	memcpy(&buff1[18 * maxlayer + 18], &finalblock, 16);

	*k0 = buff0;
	*k1 = buff1;
}